

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.c
# Opt level: O3

axbStatus_t axbOpBackendRegisterDefaults(axbHandle_s *handle)

{
  axbStatus_t aVar1;
  uint uVar2;
  uint extraout_EAX;
  ulong *puVar3;
  undefined1 *puVar4;
  undefined8 *in_RSI;
  ulong uVar5;
  
  aVar1 = axbOpBackendRegister_Host(handle);
  if (aVar1 == 0) {
    aVar1 = axbOpBackendRegister_CUDA(handle);
    if (aVar1 == 0) {
      uVar2 = axbOpBackendRegister_OpenCL(handle);
      if (uVar2 == 0) {
        return 0;
      }
      goto LAB_00105522;
    }
  }
  else {
    axbOpBackendRegisterDefaults_cold_1();
  }
  axbOpBackendRegisterDefaults_cold_2();
  uVar2 = extraout_EAX;
LAB_00105522:
  uVar5 = (ulong)uVar2;
  axbOpBackendRegisterDefaults_cold_3();
  puVar3 = (ulong *)malloc(0x48);
  *in_RSI = puVar3;
  *puVar3 = uVar5;
  *(undefined4 *)(puVar3 + 1) = 0x1d232;
  puVar4 = (undefined1 *)malloc(10);
  puVar3[4] = (ulong)puVar4;
  *puVar4 = 0;
  puVar3[3] = 10;
  puVar3[6] = 0;
  *(undefined4 *)(puVar3 + 5) = 5;
  puVar3[7] = **(ulong **)(uVar5 + 0x18);
  puVar3[8] = **(ulong **)(uVar5 + 0x30);
  return 0;
}

Assistant:

axbStatus_t axbOpBackendRegisterDefaults(struct axbHandle_s *handle)
{
  axbStatus_t status;
  status = axbOpBackendRegister_Host(handle); AXB_ERRCHK(status);
  status = axbOpBackendRegister_CUDA(handle); AXB_ERRCHK(status);
  status = axbOpBackendRegister_OpenCL(handle); AXB_ERRCHK(status);
  return 0;
}